

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManUpdateExtraAig2(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vOutsLeft;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = Tim_ManPiNum((Tim_Man_t *)pTime);
  vOutsLeft = Vec_IntAlloc(100);
  iVar6 = vBoxesLeft->nSize;
  iVar2 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar2 < iVar6) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x2d0,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar6 = p->vCos->nSize;
  iVar2 = Tim_ManCiNum((Tim_Man_t *)pTime);
  if (iVar6 == iVar2 - iVar1) {
    for (iVar6 = 0; iVar6 < vBoxesLeft->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(vBoxesLeft,iVar6);
      iVar3 = Tim_ManBoxOutputFirst((Tim_Man_t *)pTime,iVar2);
      iVar7 = 0;
      while( true ) {
        iVar4 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar2);
        if (iVar4 <= iVar7) break;
        Vec_IntPush(vOutsLeft,iVar7 + (iVar3 - iVar1));
        iVar7 = iVar7 + 1;
      }
    }
    pGVar5 = Gia_ManDupSelectedOutputs(p,vOutsLeft);
    Vec_IntFree(vOutsLeft);
    return pGVar5;
  }
  __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                ,0x2d1,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig2( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxesLeft )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    int nRealPis = Tim_ManPiNum(pManTime);
    Vec_Int_t * vOutsLeft = Vec_IntAlloc( 100 );
    int i, k, iBox, iOutFirst;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis );
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        iOutFirst = Tim_ManBoxOutputFirst(pManTime, iBox) - nRealPis;
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, iBox); k++ )
            Vec_IntPush( vOutsLeft, iOutFirst + k );
    }
    pNew = Gia_ManDupSelectedOutputs( p, vOutsLeft );
    Vec_IntFree( vOutsLeft );
    return pNew;
}